

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnn.c
# Opt level: O2

void av1_cnn_deconvolve_c
               (float **input,int in_width,int in_height,int in_stride,
               CNN_LAYER_CONFIG *layer_config,float **output,int out_stride)

{
  PADDING_TYPE PVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  undefined4 in_register_00000014;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  undefined4 in_register_00000034;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  int iVar18;
  int iVar19;
  ulong uVar20;
  ulong uVar21;
  int iVar22;
  long lVar23;
  long lVar24;
  int iVar25;
  ulong uVar26;
  long lVar27;
  float fVar28;
  int out_height;
  int out_width;
  uint local_e0;
  uint local_dc;
  ulong local_d8;
  undefined8 local_90;
  undefined8 local_88;
  float **local_68;
  float **local_48;
  
  local_90 = CONCAT44(in_register_00000034,in_width);
  local_88 = CONCAT44(in_register_00000014,in_height);
  uVar2 = layer_config->in_channels;
  local_d8 = (ulong)(uint)layer_config->out_channels;
  iVar12 = layer_config->out_channels * uVar2;
  local_dc = 0;
  local_e0 = 0;
  local_68 = output;
  local_48 = input;
  av1_find_cnn_layer_output_size(in_width,in_height,layer_config,(int *)&local_dc,(int *)&local_e0);
  PVar1 = layer_config->pad;
  iVar13 = (int)local_d8;
  if (PVar1 == '\0') {
    if ((int)uVar2 < 1) {
      uVar2 = 0;
    }
    uVar10 = (ulong)local_dc;
    if ((int)local_dc < 1) {
      uVar10 = 0;
    }
    if ((int)local_e0 < 1) {
      local_e0 = 0;
    }
    uVar8 = local_d8 & 0xffffffff;
    if (iVar13 < 1) {
      uVar8 = 0;
    }
    for (uVar11 = 0; uVar11 != uVar8; uVar11 = uVar11 + 1) {
      for (uVar17 = 0; uVar17 != local_e0; uVar17 = uVar17 + 1) {
        for (uVar9 = 0; uVar9 != uVar10; uVar9 = uVar9 + 1) {
          fVar28 = layer_config->bias[uVar11];
          for (uVar16 = 0; uVar16 != uVar2; uVar16 = uVar16 + 1) {
            lVar23 = uVar16 * local_d8 + uVar11;
            iVar13 = layer_config->filter_height;
            iVar6 = 0;
            iVar22 = 0;
            if (0 < iVar13) {
              iVar22 = iVar13;
            }
            for (; iVar6 != iVar22; iVar6 = iVar6 + 1) {
              iVar25 = layer_config->skip_height;
              uVar7 = iVar13 - iVar25;
              if (iVar13 - iVar25 < 1) {
                uVar7 = 0;
              }
              uVar3 = layer_config->filter_width;
              iVar18 = (uVar7 >> 1) + ((int)uVar17 - iVar6);
              uVar20 = 0;
              if (0 < (int)uVar3) {
                uVar20 = (ulong)uVar3;
              }
              lVar24 = (long)iVar12 * uVar20;
              lVar27 = (long)(int)lVar23 * 4;
              uVar21 = uVar9 & 0xffffffff;
              while (iVar4 = (int)uVar20, uVar20 = (ulong)(iVar4 - 1), iVar4 != 0) {
                iVar4 = layer_config->skip_width;
                uVar7 = uVar3 - iVar4;
                if ((int)uVar7 < 1) {
                  uVar7 = 0;
                }
                iVar14 = iVar18 / iVar25;
                if ((((iVar18 % iVar25 == 0) &&
                     (iVar19 = (uVar7 >> 1) + (int)uVar21, iVar5 = iVar19 / iVar4,
                     iVar19 % iVar4 == 0)) && (-1 < iVar14)) &&
                   (((iVar14 < (int)local_88 && (-1 < iVar5)) && (iVar5 < (int)local_90)))) {
                  fVar28 = fVar28 + *(float *)((long)layer_config->weights + lVar27) *
                                    local_48[uVar16][iVar14 * in_stride + iVar5];
                }
                lVar27 = lVar27 + (long)iVar12 * 4;
                uVar21 = (ulong)((int)uVar21 - 1);
              }
              lVar23 = lVar24 + (int)lVar23;
            }
          }
          local_68[uVar11][uVar9 + uVar17 * (long)out_stride] = fVar28;
        }
      }
    }
  }
  else if (PVar1 == '\x01') {
    if ((int)uVar2 < 1) {
      uVar2 = 0;
    }
    uVar10 = (ulong)local_dc;
    if ((int)local_dc < 1) {
      uVar10 = 0;
    }
    if ((int)local_e0 < 1) {
      local_e0 = 0;
    }
    uVar8 = 0;
    if (0 < iVar13) {
      uVar8 = local_d8 & 0xffffffff;
    }
    for (uVar11 = 0; uVar11 != uVar8; uVar11 = uVar11 + 1) {
      for (uVar17 = 0; uVar17 != local_e0; uVar17 = uVar17 + 1) {
        for (uVar9 = 0; uVar9 != uVar10; uVar9 = uVar9 + 1) {
          fVar28 = layer_config->bias[uVar11];
          for (uVar16 = 0; uVar16 != uVar2; uVar16 = uVar16 + 1) {
            lVar23 = uVar16 * local_d8 + uVar11;
            iVar13 = layer_config->filter_height;
            iVar6 = 0;
            iVar22 = 0;
            if (0 < iVar13) {
              iVar22 = iVar13;
            }
            for (; iVar6 != iVar22; iVar6 = iVar6 + 1) {
              iVar25 = layer_config->skip_height;
              uVar7 = iVar13 - iVar25;
              if ((int)uVar7 < 1) {
                uVar7 = 0;
              }
              uVar3 = layer_config->filter_width;
              iVar18 = (uVar7 >> 1) + ((int)uVar17 - iVar6);
              uVar20 = 0;
              if (0 < (int)uVar3) {
                uVar20 = (ulong)uVar3;
              }
              lVar24 = (long)iVar12 * uVar20;
              lVar27 = (long)(int)lVar23 * 4;
              uVar21 = uVar9 & 0xffffffff;
              while (iVar4 = (int)uVar20, uVar20 = (ulong)(iVar4 - 1), iVar4 != 0) {
                iVar4 = layer_config->skip_width;
                uVar7 = uVar3 - iVar4;
                if ((int)(uVar3 - iVar4) < 1) {
                  uVar7 = 0;
                }
                iVar14 = iVar18 / iVar25;
                if ((iVar18 % iVar25 == 0) &&
                   (iVar19 = (uVar7 >> 1) + (int)uVar21, iVar5 = iVar19 / iVar4, iVar19 % iVar4 == 0
                   )) {
                  iVar4 = iVar14;
                  if ((int)local_88 <= iVar14) {
                    iVar4 = (int)local_88 + -1;
                  }
                  iVar19 = 0;
                  if (-1 < iVar14) {
                    iVar19 = iVar4;
                  }
                  iVar4 = iVar5;
                  if ((int)local_90 <= iVar5) {
                    iVar4 = (int)local_90 + -1;
                  }
                  iVar14 = 0;
                  if (-1 < iVar5) {
                    iVar14 = iVar4;
                  }
                  fVar28 = fVar28 + *(float *)((long)layer_config->weights + lVar27) *
                                    local_48[uVar16][iVar19 * in_stride + iVar14];
                }
                lVar27 = lVar27 + (long)iVar12 * 4;
                uVar21 = (ulong)((int)uVar21 - 1);
              }
              lVar23 = lVar24 + (int)lVar23;
            }
          }
          local_68[uVar11][uVar9 + uVar17 * (long)out_stride] = fVar28;
        }
      }
    }
  }
  else if (PVar1 == '\x02') {
    uVar8 = 0;
    uVar10 = (ulong)uVar2;
    if ((int)uVar2 < 1) {
      uVar10 = uVar8;
    }
    uVar11 = (ulong)local_dc;
    if ((int)local_dc < 1) {
      uVar11 = uVar8;
    }
    uVar17 = (ulong)local_e0;
    if ((int)local_e0 < 1) {
      uVar17 = uVar8;
    }
    uVar8 = 0;
    if (0 < iVar13) {
      uVar8 = local_d8 & 0xffffffff;
    }
    for (uVar9 = 0; uVar9 != uVar8; uVar9 = uVar9 + 1) {
      for (uVar16 = 0; uVar16 != uVar17; uVar16 = uVar16 + 1) {
        for (uVar20 = 0; uVar20 != uVar11; uVar20 = uVar20 + 1) {
          fVar28 = layer_config->bias[uVar9];
          for (uVar21 = 0; uVar21 != uVar10; uVar21 = uVar21 + 1) {
            lVar23 = uVar21 * local_d8 + uVar9;
            iVar22 = 0;
            iVar13 = layer_config->filter_height;
            if (layer_config->filter_height < 1) {
              iVar13 = iVar22;
            }
            for (; iVar22 != iVar13; iVar22 = iVar22 + 1) {
              iVar6 = (int)uVar16 - iVar22;
              uVar2 = layer_config->filter_width;
              if (layer_config->filter_width < 1) {
                uVar2 = 0;
              }
              uVar26 = (ulong)uVar2;
              lVar24 = (long)iVar12 * uVar26;
              lVar27 = (long)(int)lVar23 * 4;
              uVar15 = uVar20 & 0xffffffff;
              while (iVar25 = (int)uVar26, uVar26 = (ulong)(iVar25 - 1), iVar25 != 0) {
                iVar18 = iVar6 / layer_config->skip_height;
                iVar25 = (int)uVar15;
                if (((((iVar6 % layer_config->skip_height == 0) &&
                      (iVar4 = iVar25 / layer_config->skip_width,
                      iVar25 % layer_config->skip_width == 0)) && (-1 < iVar18)) &&
                    ((iVar18 < (int)local_88 && (-1 < iVar4)))) && (iVar4 < (int)local_90)) {
                  fVar28 = fVar28 + *(float *)((long)layer_config->weights + lVar27) *
                                    local_48[uVar21][iVar18 * in_stride + iVar4];
                }
                lVar27 = lVar27 + (long)iVar12 * 4;
                uVar15 = (ulong)(iVar25 - 1);
              }
              lVar23 = lVar24 + (int)lVar23;
            }
          }
          local_68[uVar9][uVar20 + uVar16 * (long)out_stride] = fVar28;
        }
      }
    }
  }
  return;
}

Assistant:

void av1_cnn_deconvolve_c(const float **input, int in_width, int in_height,
                          int in_stride, const CNN_LAYER_CONFIG *layer_config,
                          float **output, int out_stride) {
  assert(layer_config->deconvolve);

  const int cstep = layer_config->in_channels * layer_config->out_channels;

  int out_width = 0;
  int out_height = 0;
  av1_find_cnn_layer_output_size(in_width, in_height, layer_config, &out_width,
                                 &out_height);
  switch (layer_config->pad) {
    case PADDING_SAME_ZERO:
      for (int i = 0; i < layer_config->out_channels; ++i) {
        for (int u = 0; u < out_height; ++u) {
          for (int v = 0; v < out_width; ++v) {
            float sum = layer_config->bias[i];
            for (int k = 0; k < layer_config->in_channels; ++k) {
              int off = k * layer_config->out_channels + i;
              for (int l = 0; l < layer_config->filter_height; ++l) {
                const int h =
                    u - l +
                    get_start_shift_deconvolve(layer_config->filter_height,
                                               layer_config->skip_height);
                for (int m = 0; m < layer_config->filter_width;
                     ++m, off += cstep) {
                  const int w =
                      v - m +
                      get_start_shift_deconvolve(layer_config->filter_width,
                                                 layer_config->skip_width);
                  if ((h % layer_config->skip_height) != 0 ||
                      (w % layer_config->skip_width) != 0)
                    continue;
                  const int ii = h / layer_config->skip_height;
                  const int jj = w / layer_config->skip_width;
                  if (ii < 0 || ii >= in_height || jj < 0 || jj >= in_width)
                    continue;
                  sum += layer_config->weights[off] *
                         input[k][ii * in_stride + jj];
                }
              }
            }
            output[i][u * out_stride + v] = sum;
          }
        }
      }
      break;
    case PADDING_SAME_REPLICATE:
      for (int i = 0; i < layer_config->out_channels; ++i) {
        for (int u = 0; u < out_height; ++u) {
          for (int v = 0; v < out_width; ++v) {
            float sum = layer_config->bias[i];
            for (int k = 0; k < layer_config->in_channels; ++k) {
              int off = k * layer_config->out_channels + i;
              for (int l = 0; l < layer_config->filter_height; ++l) {
                const int h =
                    u - l +
                    get_start_shift_deconvolve(layer_config->filter_height,
                                               layer_config->skip_height);
                for (int m = 0; m < layer_config->filter_width;
                     ++m, off += cstep) {
                  const int w =
                      v - m +
                      get_start_shift_deconvolve(layer_config->filter_width,
                                                 layer_config->skip_width);
                  if ((h % layer_config->skip_height) != 0 ||
                      (w % layer_config->skip_width) != 0)
                    continue;
                  const int ii =
                      CLAMPINDEX(h / layer_config->skip_height, in_height);
                  const int jj =
                      CLAMPINDEX(w / layer_config->skip_width, in_width);
                  assert(ii >= 0 && ii < in_height && jj >= 0 && jj < in_width);
                  sum += layer_config->weights[off] *
                         input[k][ii * in_stride + jj];
                }
              }
            }
            output[i][u * out_stride + v] = sum;
          }
        }
      }
      break;
    case PADDING_VALID:
      for (int i = 0; i < layer_config->out_channels; ++i) {
        for (int u = 0; u < out_height; ++u) {
          for (int v = 0; v < out_width; ++v) {
            float sum = layer_config->bias[i];
            for (int k = 0; k < layer_config->in_channels; ++k) {
              int off = k * layer_config->out_channels + i;
              for (int l = 0; l < layer_config->filter_height; ++l) {
                const int h = u - l;
                for (int m = 0; m < layer_config->filter_width;
                     ++m, off += cstep) {
                  const int w = v - m;
                  if ((h % layer_config->skip_height) != 0 ||
                      (w % layer_config->skip_width) != 0)
                    continue;
                  const int ii = h / layer_config->skip_height;
                  const int jj = w / layer_config->skip_width;
                  if (ii < 0 || ii >= in_height || jj < 0 || jj >= in_width)
                    continue;
                  sum += layer_config->weights[off] *
                         input[k][ii * in_stride + jj];
                }
              }
            }
            output[i][u * out_stride + v] = sum;
          }
        }
      }
      break;
    default: assert(0 && "Unknown padding type");
  }
}